

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::Impl::Impl
          (Impl *this,VatNetworkBase *network,Maybe<capnp::Capability::Client> *bootstrapInterface)

{
  SourceLocation location;
  SourceLocation location_00;
  undefined1 local_78 [32];
  anon_union_16_1_a8c68091_for_NullableValue<capnp::Capability::Client>_2 aStack_58;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  (this->super_BootstrapFactoryBase)._vptr_BootstrapFactoryBase =
       (_func_int **)&PTR_baseCreateFor_00665fb8;
  (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)&DAT_00665fd8;
  this->network = network;
  local_78._16_8_ = &this->bootstrapInterface;
  kj::Maybe<capnp::Capability::Client>::Maybe
            ((Maybe<capnp::Capability::Client> *)local_78._16_8_,bootstrapInterface);
  this->bootstrapFactory = &this->super_BootstrapFactoryBase;
  this->flowLimit = 0xffffffffffffffff;
  (this->traceEncoder).ptr.isSet = false;
  (this->acceptLoopPromise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  kj::refcounted<capnp::_::(anonymous_namespace)::RpcSystemBrand>();
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++";
  pcStack_40 = "Impl";
  local_38._0_1_ = true;
  local_38._1_7_ = 0x22000011;
  location.function = "Impl";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  location.lineNumber = 0x11a4;
  location.columnNumber = 0x22;
  kj::TaskSet::TaskSet(&this->tasks,&this->super_ErrorHandler,location);
  (this->connections).table.rows.builder.ptr = (Entry *)0x0;
  (this->connections).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::_::VatNetworkBase::Connection_*,_kj::Own<capnp::_::RpcSystemBase::RpcConnectionState>_>::Entry>
        *)0x0;
  (this->connections).table.rows.builder.endPtr = (Entry *)0x0;
  (this->connections).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (this->connections).table.indexes.erasedCount = 0;
  (this->connections).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->connections).table.indexes.buckets.size_ = 0;
  (this->connections).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  acceptLoop((Impl *)local_78);
  local_78._24_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  aStack_58.value.hook.disposer = (Disposer *)0x4d626d;
  aStack_58.value.hook.ptr = (ClientHook *)0x19000011a5;
  location_00.function = "Impl";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
  ;
  location_00.lineNumber = 0x11a5;
  location_00.columnNumber = 0x19;
  kj::Promise<void>::
  eagerlyEvaluate<capnp::_::RpcSystemBase::Impl::Impl(capnp::_::VatNetworkBase&,kj::Maybe<capnp::Capability::Client>)::_lambda(kj::Exception&&)_1_>
            ((Promise<void> *)(local_78 + 8),(anon_class_1_0_00000001_for_errorHandler *)local_78,
             location_00);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->acceptLoopPromise,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_78 + 8));
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_78 + 8));
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_78);
  return;
}

Assistant:

Impl(VatNetworkBase& network, kj::Maybe<Capability::Client> bootstrapInterface)
      : network(network), bootstrapInterface(kj::mv(bootstrapInterface)),
        bootstrapFactory(*this), tasks(*this) {
    acceptLoopPromise = acceptLoop().eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
  }